

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::PolyKernel::MergeFrom(PolyKernel *this,PolyKernel *from)

{
  double dVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/SVM.pb.cc"
               ,0x2b2);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  dVar1 = from->c_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->c_ = dVar1;
  }
  dVar1 = from->gamma_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->gamma_ = dVar1;
  }
  if (from->degree_ != 0) {
    this->degree_ = from->degree_;
  }
  return;
}

Assistant:

void PolyKernel::MergeFrom(const PolyKernel& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.PolyKernel)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.c() != 0) {
    set_c(from.c());
  }
  if (from.gamma() != 0) {
    set_gamma(from.gamma());
  }
  if (from.degree() != 0) {
    set_degree(from.degree());
  }
}